

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcm2wav.cc
# Opt level: O2

PBuffer __thiscall ConvertorPCM2WAV::convert(ConvertorPCM2WAV *this)

{
  PMutableBuffer *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ConvertorPCM2WAV *in_RSI;
  PBuffer PVar1;
  allocator<char> local_99;
  PBuffer header;
  string local_88;
  PBuffer data;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  header.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 1;
  std::make_shared<MutableBuffer,Buffer::EndianessMode>((EndianessMode *)&local_88);
  this_00 = &in_RSI->result;
  std::__shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2> *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
  create_header((ConvertorPCM2WAV *)&header);
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,
             &(in_RSI->super_Convertor).buffer.
              super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
  (*(in_RSI->super_Convertor)._vptr_Convertor[3])(&data);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  MutableBuffer::push((this_00->super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr,"RIFF");
  MutableBuffer::push<unsigned_int>
            ((this_00->super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
             (int)(data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->size + 0x14
             + *(int *)(CONCAT44(header.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr._4_4_,
                                 header.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr._0_4_) + 0x20),1);
  MutableBuffer::push((this_00->super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr,"WAVE");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"fmt ",&local_99);
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,&header.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
  write_chunk(in_RSI,&local_88,(PBuffer *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"data",&local_99);
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,&data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
  write_chunk(in_RSI,&local_88,(PBuffer *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__cxx11::string::~string((string *)&local_88);
  std::__shared_ptr<Buffer,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<MutableBuffer,void>
            ((__shared_ptr<Buffer,(__gnu_cxx::_Lock_policy)2> *)this,
             &this_00->super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&header.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  PVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PBuffer)PVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PBuffer
ConvertorPCM2WAV::convert() {
  result = std::make_shared<MutableBuffer>(Buffer::EndianessLittle);

  PBuffer header = create_header();
  PBuffer data = create_data(buffer);

  result->push("RIFF");
  result->push<uint32_t>(static_cast<uint32_t>(header->get_size() +
                                               data->get_size() + 20));
  result->push("WAVE");
  write_chunk("fmt ", header);
  write_chunk("data", data);

  return result;
}